

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_extensions.cpp
# Opt level: O3

void __thiscall ONX_Model::DumpComponentLists(ONX_Model *this,ON_TextLog *dump)

{
  Type component_type;
  wchar_t *pwVar1;
  long lVar2;
  ON_wString type_name;
  
  lVar2 = 0;
  do {
    component_type = (&DAT_006aea60)[lVar2];
    ON_ModelComponent::ComponentTypeToString
              ((ON_ModelComponent *)&stack0xffffffffffffffc8,component_type);
    pwVar1 = ON_wString::operator_cast_to_wchar_t_((ON_wString *)&stack0xffffffffffffffc8);
    ON_TextLog::Print(dump,L"%ls table:\n",pwVar1);
    ON_TextLog::PushIndent(dump);
    DumpComponentList(this,component_type,dump);
    ON_TextLog::PopIndent(dump);
    ON_TextLog::Print(dump,"\n");
    ON_wString::~ON_wString((ON_wString *)&stack0xffffffffffffffc8);
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0xf);
  return;
}

Assistant:

void ONX_Model::DumpComponentLists( ON_TextLog& dump ) const
{
  const ON_ModelComponent::Type table_types[] =
  {
    ON_ModelComponent::Type::Image,
    ON_ModelComponent::Type::TextureMapping,
    ON_ModelComponent::Type::Material,
    ON_ModelComponent::Type::LinePattern,
    ON_ModelComponent::Type::Layer,
    ON_ModelComponent::Type::Group,
    ON_ModelComponent::Type::TextStyle,
    ON_ModelComponent::Type::DimStyle,
    ON_ModelComponent::Type::RenderLight,
    ON_ModelComponent::Type::HatchPattern,
    ON_ModelComponent::Type::ModelGeometry,
    ON_ModelComponent::Type::HistoryRecord,
    ON_ModelComponent::Type::RenderContent,
    ON_ModelComponent::Type::EmbeddedFile,
    //ON_ModelComponent::Type::ObsoleteValue,
    ON_ModelComponent::Type::SectionStyle,
    ON_ModelComponent::Type::Unset // list terminator
  };

  for (unsigned i = 0; ON_ModelComponent::Type::Unset != table_types[i]; i++)
  {
    ON_wString type_name = ON_ModelComponent::ComponentTypeToString(table_types[i]);
    dump.Print(L"%ls table:\n",static_cast<const wchar_t*>(type_name));
    dump.PushIndent();
    DumpComponentList(table_types[i],dump);
    dump.PopIndent();
    dump.Print("\n");
  }
}